

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_2000_2999.cpp
# Opt level: O3

void __thiscall psy::C::DeclarationBinderTester::case2251(DeclarationBinderTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Decl *pDVar3;
  Expectation *pEVar4;
  socklen_t __len;
  string local_390;
  string local_370;
  long *local_350 [2];
  long local_340 [2];
  Expectation local_330;
  Expectation local_278;
  Decl local_1c0;
  Decl local_f8;
  
  local_350[0] = local_340;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_350,"struct { x * const y ; } ;","");
  Expectation::Expectation(&local_330);
  Decl::Decl(&local_f8);
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"y","");
  pDVar3 = Decl::Member(&local_f8,&local_370,FieldDeclaration);
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"x","");
  pDVar3 = Ty::Typedef(&pDVar3->ty_,&local_390,None);
  __len = 0;
  pDVar3 = Ty::Derived(&pDVar3->ty_,Pointer,Const,None);
  paVar1 = &local_1c0.ident_.field_2;
  pcVar2 = (pDVar3->ident_)._M_dataplus._M_p;
  local_1c0.ident_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar2,pcVar2 + (pDVar3->ident_)._M_string_length);
  local_1c0.ns_ = pDVar3->ns_;
  local_1c0.declK_ = pDVar3->declK_;
  local_1c0.tyDeclK_ = pDVar3->tyDeclK_;
  local_1c0.symK_ = pDVar3->symK_;
  local_1c0.scopeK_ = pDVar3->scopeK_;
  Ty::Ty(&local_1c0.ty_,&pDVar3->ty_);
  pEVar4 = Expectation::declaration(&local_330,&local_1c0);
  Expectation::Expectation(&local_278,pEVar4);
  bind(this,(int)local_350,(sockaddr *)&local_278,__len);
  if (local_278.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_278.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_278.declarations_);
  if (local_278.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.ambiguityText_._M_dataplus._M_p != &local_278.ambiguityText_.field_2) {
    operator_delete(local_278.ambiguityText_._M_dataplus._M_p,
                    local_278.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278.descriptorsE_);
  Ty::~Ty(&local_1c0.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.ident_._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0.ident_._M_dataplus._M_p,
                    local_1c0.ident_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  Ty::~Ty(&local_f8.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.ident_._M_dataplus._M_p != &local_f8.ident_.field_2) {
    operator_delete(local_f8.ident_._M_dataplus._M_p,
                    local_f8.ident_.field_2._M_allocated_capacity + 1);
  }
  if (local_330.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_330.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_330.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_330.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_330.declarations_);
  if (local_330.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_330.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_330.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_330.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.ambiguityText_._M_dataplus._M_p != &local_330.ambiguityText_.field_2) {
    operator_delete(local_330.ambiguityText_._M_dataplus._M_p,
                    local_330.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_330.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_330.descriptorsE_);
  if (local_350[0] != local_340) {
    operator_delete(local_350[0],local_340[0] + 1);
  }
  return;
}

Assistant:

void DeclarationBinderTester::case2251()
{
    bind("struct { x * const y ; } ;",
         Expectation()
             .declaration(Decl().Member("y", SymbolKind::FieldDeclaration)
                      .ty_.Typedef("x", CVR::None)
                      .ty_.Derived(TypeKind::Pointer, CVR::Const)));
}